

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O1

bool __thiscall input_mod::open2(input_mod *this,long pos)

{
  DUH_SIGRENDERER *pDVar1;
  DUMB_IT_SIGRENDERER *sigrenderer;
  
  if (this->start_order == 0) {
    pDVar1 = duh_start_sigrenderer(this->duh,0,2,(int32)pos);
    this->sr = pDVar1;
  }
  else {
    pDVar1 = dumb_it_start_at_order(this->duh,2,this->start_order);
    this->sr = pDVar1;
    if (pos != 0 && pDVar1 != (DUH_SIGRENDERER *)0x0) {
      duh_sigrenderer_generate_samples(pDVar1,0.0,1.0,(int32)pos,(sample_t_conflict **)0x0);
    }
  }
  pDVar1 = this->sr;
  if (pDVar1 != (DUH_SIGRENDERER *)0x0) {
    sigrenderer = duh_get_it_sigrenderer(pDVar1);
    dumb_it_set_resampling_quality(sigrenderer,this->interp);
    dumb_it_set_ramp_style(sigrenderer,this->volramp);
    if ((this->super_StreamSong).super_MusInfo.m_Looping == false) {
      dumb_it_set_loop_callback(sigrenderer,dumb_it_callback_terminate,(void *)0x0);
    }
    dumb_it_set_xm_speed_zero_callback(sigrenderer,dumb_it_callback_terminate,(void *)0x0);
    dumb_it_set_global_volume_zero_callback(sigrenderer,dumb_it_callback_terminate,(void *)0x0);
  }
  return pDVar1 != (DUH_SIGRENDERER *)0x0;
}

Assistant:

bool input_mod::open2(long pos)
{
	if (start_order != 0)
	{
		sr = dumb_it_start_at_order(duh, 2, start_order);
		if (sr && pos) duh_sigrenderer_generate_samples(sr, 0, 1, pos, 0);
	}
	else
	{
		sr = duh_start_sigrenderer(duh, 0, 2, pos);
	}
	if (!sr)
	{
		return false;
	}

	DUMB_IT_SIGRENDERER *itsr = duh_get_it_sigrenderer(sr);
	dumb_it_set_resampling_quality(itsr, interp);
	dumb_it_set_ramp_style(itsr, volramp);
	if (!m_Looping)
	{
		dumb_it_set_loop_callback(itsr, &dumb_it_callback_terminate, NULL);
	}
	dumb_it_set_xm_speed_zero_callback(itsr, &dumb_it_callback_terminate, NULL);
	dumb_it_set_global_volume_zero_callback(itsr, &dumb_it_callback_terminate, NULL);
	return true;
}